

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flash.cpp
# Opt level: O1

void __thiscall
Flash::Flash(Flash *this,Samba *samba,string *name,uint32_t addr,uint32_t pages,uint32_t size,
            uint32_t planes,uint32_t lockRegions,uint32_t user,uint32_t stack)

{
  WordCopyApplet *this_00;
  pointer pcVar1;
  uint uVar2;
  
  this->_vptr_Flash = (_func_int **)&PTR__Flash_00119158;
  this->_samba = samba;
  (this->_name)._M_dataplus._M_p = (pointer)&(this->_name).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_name,pcVar1,pcVar1 + name->_M_string_length);
  this->_addr = addr;
  this->_pages = pages;
  this->_size = size;
  this->_planes = planes;
  this->_lockRegions = lockRegions;
  this->_user = user;
  this_00 = &this->_wordCopy;
  WordCopyApplet::WordCopyApplet(this_00,samba,user);
  (this->_bootFlash)._vptr_FlashOption = (_func_int **)&PTR__FlashOption_001192c8;
  (this->_bootFlash)._dirty = false;
  (this->_regions)._vptr_FlashOption = (_func_int **)&PTR__FlashOption_00119298;
  (this->_regions)._value.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  *(uint *)((long)&(this->_regions)._value.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base + 8) = 0;
  (this->_regions)._value.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  *(uint *)((long)&(this->_regions)._value.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base + 8) = 0;
  (this->_regions)._value.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  (this->_regions)._dirty = false;
  (this->_bod)._vptr_FlashOption = (_func_int **)&PTR__FlashOption_001192c8;
  (this->_bod)._dirty = false;
  (this->_bor)._vptr_FlashOption = (_func_int **)&PTR__FlashOption_001192c8;
  (this->_bor)._dirty = false;
  (this->_security)._vptr_FlashOption = (_func_int **)&PTR__FlashOption_001192c8;
  (this->_security)._dirty = false;
  if ((size & size - 1) != 0) {
    __assert_fail("(size & (size - 1)) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Seeed-Studio[P]BOSSA/src/Flash.cpp"
                  ,0x2d,
                  "Flash::Flash(Samba &, const std::string &, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t)"
                 );
  }
  if ((pages & pages - 1) == 0) {
    if ((lockRegions & lockRegions - 1) == 0) {
      WordCopyApplet::setWords(this_00,size >> 2);
      Applet::setStack(&this_00->super_Applet,stack);
      this->_onBufferA = true;
      uVar2 = this->_user + (this->_wordCopy).super_Applet._size + 3 & 0xfffffffc;
      this->_pageBufferA = uVar2;
      this->_pageBufferB = uVar2 + size;
      return;
    }
    __assert_fail("(lockRegions & (lockRegions - 1)) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Seeed-Studio[P]BOSSA/src/Flash.cpp"
                  ,0x2f,
                  "Flash::Flash(Samba &, const std::string &, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t)"
                 );
  }
  __assert_fail("(pages & (pages - 1)) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Seeed-Studio[P]BOSSA/src/Flash.cpp"
                ,0x2e,
                "Flash::Flash(Samba &, const std::string &, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t)"
               );
}

Assistant:

Flash::Flash(Samba& samba,
             const std::string& name,
             uint32_t addr,
             uint32_t pages,
             uint32_t size,
             uint32_t planes,
             uint32_t lockRegions,
             uint32_t user,
             uint32_t stack)
    : _samba(samba), _name(name), _addr(addr), _pages(pages), _size(size),
      _planes(planes), _lockRegions(lockRegions), _user(user), _wordCopy(samba, user)
{
    assert((size & (size - 1)) == 0);
    assert((pages & (pages - 1)) == 0);
    assert((lockRegions & (lockRegions - 1)) == 0);
   
    _wordCopy.setWords(size / sizeof(uint32_t));
    
    _wordCopy.setStack(stack);

    _onBufferA = true;

    // page buffers will have the size of a physical page and will be situated right after the applet
    _pageBufferA = ((_user + _wordCopy.size() + 3) / 4) * 4; // we need to avoid non 32bits aligned access on Cortex-M0+
    _pageBufferB = _pageBufferA + size;
}